

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

bool __thiscall
QSocks5SocketEngine::initialize
          (QSocks5SocketEngine *this,qintptr socketDescriptor,SocketState socketState)

{
  QSocks5SocketEnginePrivate *this_00;
  QObject *pQVar1;
  NetworkLayerProtocol NVar2;
  Type *this_01;
  QSocks5BindData *pQVar3;
  QSocks5ConnectData *pQVar4;
  long lVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QAbstractSocket local_40;
  
  local_40._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  if (socketState == ConnectedState) {
    this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
    this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>::
              operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>
                          *)this);
    pQVar3 = QSocks5BindStore::retrieve(this_01,socketDescriptor);
    if (pQVar3 != (QSocks5BindData *)0x0) {
      (this_00->super_QAbstractSocketEnginePrivate).socketState = ConnectedState;
      (this_00->super_QAbstractSocketEnginePrivate).socketType = TcpSocket;
      pQVar4 = (QSocks5ConnectData *)operator_new(0x38);
      (pQVar4->readBuffer).buffers.d.d = (Data *)0x0;
      (pQVar4->readBuffer).buffers.d.ptr = (QRingChunk *)0x0;
      (pQVar4->readBuffer).buffers.d.size = 0;
      (pQVar4->readBuffer).bufferSize = 0;
      (pQVar4->readBuffer).basicBlockSize = 0x1000;
      this_00->connectData = pQVar4;
      this_00->data = (QSocks5Data *)pQVar4;
      this_00->mode = ConnectMode;
      pQVar1 = (QObject *)(pQVar3->super_QSocks5Data).controlSocket;
      (pQVar4->super_QSocks5Data).controlSocket = (QTcpSocket *)pQVar1;
      (pQVar3->super_QSocks5Data).controlSocket = (QTcpSocket *)0x0;
      QObject::setParent(pQVar1);
      QAbstractSocket::localAddress(&local_40);
      NVar2 = QHostAddress::protocol((QHostAddress *)&local_40);
      (this_00->super_QAbstractSocketEnginePrivate).socketProtocol = NVar2;
      QHostAddress::~QHostAddress((QHostAddress *)&local_40);
      this_00->data->authenticator = (pQVar3->super_QSocks5Data).authenticator;
      (pQVar3->super_QSocks5Data).authenticator = (QSocks5Authenticator *)0x0;
      (this_00->super_QAbstractSocketEnginePrivate).localPort = pQVar3->localPort;
      QHostAddress::operator=
                (&(this_00->super_QAbstractSocketEnginePrivate).localAddress,&pQVar3->localAddress);
      (this_00->super_QAbstractSocketEnginePrivate).peerPort = pQVar3->peerPort;
      QHostAddress::operator=
                (&(this_00->super_QAbstractSocketEnginePrivate).peerAddress,&pQVar3->peerAddress);
      (this_00->super_QAbstractSocketEnginePrivate).inboundStreamCount = 1;
      (this_00->super_QAbstractSocketEnginePrivate).outboundStreamCount = 1;
      QHostAddress::~QHostAddress(&pQVar3->peerAddress);
      QHostAddress::~QHostAddress(&pQVar3->localAddress);
      operator_delete(pQVar3,0x40);
      QObject::connect(local_48,(char *)this_00->data->controlSocket,(QObject *)"2connected()",
                       (char *)this,0x27c3a9);
      QMetaObject::Connection::~Connection((Connection *)local_48);
      QObject::connect(local_50,(char *)this_00->data->controlSocket,(QObject *)"2readyRead()",
                       (char *)this,0x27c3c6);
      QMetaObject::Connection::~Connection((Connection *)local_50);
      QObject::connect(local_58,(char *)this_00->data->controlSocket,
                       (QObject *)"2bytesWritten(qint64)",(char *)this,0x27c3ea);
      QMetaObject::Connection::~Connection((Connection *)local_58);
      QObject::connect(local_60,(char *)this_00->data->controlSocket,
                       (QObject *)"2errorOccurred(QAbstractSocket::SocketError)",(char *)this,
                       0x27c40a);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      QObject::connect(local_68,(char *)this_00->data->controlSocket,(QObject *)"2disconnected()",
                       (char *)this,0x27c447);
      QMetaObject::Connection::~Connection((Connection *)local_68);
      QObject::connect(local_70,(char *)this_00->data->controlSocket,
                       (QObject *)"2stateChanged(QAbstractSocket::SocketState)",(char *)this,
                       0x27c467);
      QMetaObject::Connection::~Connection((Connection *)local_70);
      this_00->socks5State = Connected;
      lVar5 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket + 0xa0))();
      bVar6 = true;
      if (lVar5 != 0) {
        QSocks5SocketEnginePrivate::_q_controlSocketReadNotification(this_00);
      }
      goto LAB_00239dce;
    }
  }
  bVar6 = false;
LAB_00239dce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_40._8_8_) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::initialize(qintptr socketDescriptor, QAbstractSocket::SocketState socketState)
{
    Q_D(QSocks5SocketEngine);

    QSOCKS5_Q_DEBUG << "initialize" << socketDescriptor;

    // this is only valid for the other side of a bind, nothing else is supported

    if (socketState != QAbstractSocket::ConnectedState) {
        //### must be connected state ???
        return false;
    }

    QSocks5BindData *bindData = socks5BindStore()->retrieve(socketDescriptor);
    if (bindData) {

        d->socketState = QAbstractSocket::ConnectedState;
        d->socketType = QAbstractSocket::TcpSocket;
        d->connectData = new QSocks5ConnectData;
        d->data = d->connectData;
        d->mode = QSocks5SocketEnginePrivate::ConnectMode;
        d->data->controlSocket = bindData->controlSocket;
        bindData->controlSocket = nullptr;
        d->data->controlSocket->setParent(this);
        d->socketProtocol = d->data->controlSocket->localAddress().protocol();
        d->data->authenticator = bindData->authenticator;
        bindData->authenticator = nullptr;
        d->localPort = bindData->localPort;
        d->localAddress = bindData->localAddress;
        d->peerPort = bindData->peerPort;
        d->peerAddress = bindData->peerAddress;
        d->inboundStreamCount = d->outboundStreamCount = 1;
        delete bindData;

        QObject::connect(d->data->controlSocket, SIGNAL(connected()), this, SLOT(_q_controlSocketConnected()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(readyRead()), this, SLOT(_q_controlSocketReadNotification()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(bytesWritten(qint64)), this, SLOT(_q_controlSocketBytesWritten()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(errorOccurred(QAbstractSocket::SocketError)), this, SLOT(_q_controlSocketErrorOccurred(QAbstractSocket::SocketError)),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(disconnected()), this, SLOT(_q_controlSocketDisconnected()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(stateChanged(QAbstractSocket::SocketState)),
                         this, SLOT(_q_controlSocketStateChanged(QAbstractSocket::SocketState)),
                         Qt::DirectConnection);

        d->socks5State = QSocks5SocketEnginePrivate::Connected;

        if (d->data->controlSocket->bytesAvailable() != 0)
            d->_q_controlSocketReadNotification();
        return true;
    }
    return false;
}